

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetAccessIds
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MemoryObject *this)

{
  long lVar1;
  IRContext *this_00;
  ConstantManager *pCVar2;
  pointer pAVar3;
  pointer pAVar4;
  pointer puVar5;
  const_iterator cVar6;
  long lVar7;
  allocator_type local_3d;
  uint32_t local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  this_00 = this->variable_inst_->context_;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  pCVar2 = (this_00->constant_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  local_38 = __return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(this->access_chain_).
                   super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->access_chain_).
                   super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_3d);
  pAVar3 = (this->access_chain_).
           super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = (this->access_chain_).
           super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar3 != pAVar4) {
    puVar5 = (local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      local_3c = *(uint32_t *)((long)&pAVar3->field_1 + lVar7 * 2);
      if ((&pAVar3->is_result_id)[lVar7 * 2] == true) {
        cVar6 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(pCVar2->id_to_const_val_)._M_h,&local_3c);
        if ((cVar6.
             super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
             ._M_cur == (__node_type *)0x0) ||
           (*(Constant **)
             ((long)cVar6.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                    ._M_cur + 0x10) == (Constant *)0x0)) {
          local_3c = 0;
        }
        else {
          local_3c = analysis::Constant::GetU32
                               (*(Constant **)
                                 ((long)cVar6.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                                        ._M_cur + 0x10));
        }
      }
      lVar1 = lVar7 * 2;
      *(uint32_t *)((long)puVar5 + lVar7) = local_3c;
      lVar7 = lVar7 + 4;
    } while ((pointer)(&pAVar3[1].is_result_id + lVar1) != pAVar4);
  }
  return local_38;
}

Assistant:

std::vector<uint32_t> CopyPropagateArrays::MemoryObject::GetAccessIds() const {
  analysis::ConstantManager* const_mgr =
      variable_inst_->context()->get_constant_mgr();

  std::vector<uint32_t> indices(AccessChain().size());
  std::transform(AccessChain().cbegin(), AccessChain().cend(), indices.begin(),
                 [&const_mgr](const AccessChainEntry& entry) {
                   if (entry.is_result_id) {
                     const analysis::Constant* constant =
                         const_mgr->FindDeclaredConstant(entry.result_id);
                     return constant == nullptr ? 0 : constant->GetU32();
                   }

                   return entry.immediate;
                 });
  return indices;
}